

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void writeBits(LodePNGBitWriter *writer,uint value,size_t nbits)

{
  byte *pbVar1;
  ucvector *puVar2;
  uint uVar3;
  byte bVar4;
  size_t sVar5;
  size_t size;
  
  if (nbits != 0) {
    if (nbits == 1) {
      bVar4 = writer->bp & 7;
      if (bVar4 == 0) {
        puVar2 = writer->data;
        sVar5 = puVar2->size + 1;
        puVar2->size = sVar5;
        uVar3 = ucvector_reserve(puVar2,sVar5);
        if (uVar3 == 0) {
          return;
        }
        writer->data->data[writer->data->size - 1] = '\0';
        bVar4 = writer->bp & 7;
      }
      pbVar1 = writer->data->data + (writer->data->size - 1);
      *pbVar1 = *pbVar1 | (byte)(value << bVar4);
      writer->bp = writer->bp + '\x01';
    }
    else {
      bVar4 = writer->bp;
      sVar5 = 0;
      do {
        bVar4 = bVar4 & 7;
        if (bVar4 == 0) {
          puVar2 = writer->data;
          size = puVar2->size + 1;
          puVar2->size = size;
          uVar3 = ucvector_reserve(puVar2,size);
          if (uVar3 == 0) {
            return;
          }
          writer->data->data[writer->data->size - 1] = '\0';
          bVar4 = writer->bp & 7;
        }
        pbVar1 = writer->data->data + (writer->data->size - 1);
        *pbVar1 = *pbVar1 | ((value >> ((uint)sVar5 & 0x1f) & 1) != 0) << bVar4;
        bVar4 = writer->bp + 1;
        writer->bp = bVar4;
        sVar5 = sVar5 + 1;
      } while (nbits != sVar5);
    }
  }
  return;
}

Assistant:

static void writeBits(LodePNGBitWriter* writer, unsigned value, size_t nbits) {
  if(nbits == 1) { /* compiler should statically compile this case if nbits == 1 */
    WRITEBIT(writer, value);
  } else {
    /* TODO: increase output size only once here rather than in each WRITEBIT */
    size_t i;
    for(i = 0; i != nbits; ++i) {
      WRITEBIT(writer, (unsigned char)((value >> i) & 1));
    }
  }
}